

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

RDL_cycleIterator * RDL_cycleIteratorNext(RDL_cycleIterator *it)

{
  char cVar1;
  RDL_data *pRVar2;
  RDL_URFinfo *pRVar3;
  RDL_cfam *pRVar4;
  RDL_sPathInfo *spi;
  uchar *dst;
  bool bVar5;
  uint uVar6;
  RDL_pathIterator *pRVar7;
  RDL_pathIterator *pRVar8;
  RDL_cycleIterator *pRVar9;
  uint from;
  RDL_graph *pRVar10;
  RDL_cycleIterator *unaff_R14;
  
  if (it == (RDL_cycleIterator *)0x0) {
    pRVar9 = (RDL_cycleIterator *)0x0;
    (*RDL_outputFunc)(RDL_ERROR,"Iterator is NULL!\n");
  }
  else {
    cVar1 = it->end;
    if (cVar1 == '\0') {
      bVar5 = false;
      do {
        pRVar2 = it->data;
        uVar6 = it->bcc_index;
        pRVar3 = pRVar2->urfInfoPerBCC[uVar6];
        pRVar4 = pRVar3->URFs[it->urf_index][it->rcf_index];
        pRVar10 = pRVar2->bccGraphs->bcc_graphs[uVar6];
        spi = pRVar2->spiPerBCC[uVar6];
        if (it->it2 == (RDL_pathIterator *)0x0) {
          pRVar7 = RDL_listPaths(pRVar4->r,pRVar4->q,it->mode,pRVar10,spi);
          it->it2 = pRVar7;
        }
        else {
          RDL_pathIteratorNext(it->it2);
        }
        pRVar7 = it->it1;
        if (pRVar7 == (RDL_pathIterator *)0x0) {
          pRVar7 = RDL_listPaths(pRVar4->r,pRVar4->p,it->mode,pRVar10,spi);
          it->it1 = pRVar7;
        }
        pRVar8 = it->it2;
        if ((pRVar8->end != '\0') && (pRVar7->end == '\0')) {
          RDL_pathIteratorNext(pRVar7);
          RDL_deletePathIterator(it->it2);
          pRVar8 = RDL_listPaths(pRVar4->r,pRVar4->q,it->mode,pRVar10,spi);
          it->it2 = pRVar8;
          pRVar7 = it->it1;
        }
        if ((pRVar7->end == '\0') && (pRVar8->end == '\0')) {
          dst = it->compressed_cycle;
          memcpy(dst,pRVar7->compressed_path,(ulong)pRVar7->compressed_number);
          RDL_bitset_or_inplace(dst,pRVar8->compressed_path,pRVar8->compressed_number);
          uVar6 = pRVar4->x;
          if (pRVar7->mode == 'a') {
            if (uVar6 != 0xffffffff) goto LAB_00104e54;
          }
          else {
            pRVar10 = pRVar7->gra;
            from = pRVar4->p;
            if (uVar6 == 0xffffffff) {
              uVar6 = pRVar4->q;
            }
            else {
              uVar6 = RDL_edgeId(pRVar10,from,uVar6);
              RDL_bitset_set(dst,uVar6);
              pRVar10 = pRVar7->gra;
              from = pRVar4->q;
              uVar6 = pRVar4->x;
            }
            uVar6 = RDL_edgeId(pRVar10,from,uVar6);
LAB_00104e54:
            RDL_bitset_set(dst,uVar6);
          }
joined_r0x00104e68:
          if (!bVar5) {
            return it;
          }
          goto LAB_00104da9;
        }
        if (it->rcf_index == it->rcf_index_max) {
          if (it->urf_index == it->urf_index_max) {
            if (it->bcc_index == it->bcc_index_max) {
              it->end = '\x01';
              goto joined_r0x00104e68;
            }
            uVar6 = it->bcc_index + 1;
            it->bcc_index = uVar6;
            it->urf_index = 0;
            pRVar2 = it->data;
            it->urf_index_max = pRVar2->nofURFsPerBCC[uVar6] - 1;
            it->rcf_index = 0;
            it->rcf_index_max = *pRVar2->urfInfoPerBCC[uVar6]->nofCFsPerURF - 1;
            uVar6 = (&pRVar2->bccGraphs->bcc_graphs[uVar6]->V)[it->mode != 'a'];
            free(it->compressed_cycle);
            RDL_bitset_init(&it->compressed_cycle,uVar6);
            pRVar7 = it->it1;
          }
          else {
            uVar6 = it->urf_index + 1;
            it->urf_index = uVar6;
            it->rcf_index = 0;
            it->rcf_index_max = pRVar3->nofCFsPerURF[uVar6] - 1;
          }
          RDL_deletePathIterator(pRVar7);
        }
        else {
          it->rcf_index = it->rcf_index + 1;
          it->running_rcf = it->running_rcf + 1;
          RDL_deletePathIterator(pRVar7);
        }
        it->it1 = (RDL_pathIterator *)0x0;
        RDL_deletePathIterator(it->it2);
        if (!bVar5) {
          unaff_R14 = it;
        }
        it->it2 = (RDL_pathIterator *)0x0;
        bVar5 = true;
      } while (it->end == '\0');
    }
    pRVar9 = (RDL_cycleIterator *)0x0;
    (*RDL_outputFunc)(RDL_ERROR,"Cannot advance iterator at end!\n");
    if (cVar1 == '\0') {
LAB_00104da9:
      pRVar9 = unaff_R14;
    }
  }
  return pRVar9;
}

Assistant:

RDL_cycleIterator* RDL_cycleIteratorNext(RDL_cycleIterator* it)
{
  const RDL_URFinfo *uInfo;
  const RDL_cfam *cfam;
  const RDL_graph *gra;
  const RDL_sPathInfo *spi;
  unsigned number;

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    return NULL;
  }

  if (RDL_cycleIteratorAtEnd(it)) {
    RDL_outputFunc(RDL_ERROR, "Cannot advance iterator at end!\n");
    return NULL;
  }

  uInfo = it->data->urfInfoPerBCC[it->bcc_index];
  cfam = uInfo->URFs[it->urf_index][it->rcf_index];
  gra = it->data->bccGraphs->bcc_graphs[it->bcc_index];
  spi = it->data->spiPerBCC[it->bcc_index];

  /* first call */
  if (it->it2 == NULL) {
    it->it2 = RDL_listPaths(cfam->r, cfam->q, it->mode, gra, spi);
  }
  else {
    /* advance second iterator */
    RDL_pathIteratorNext(it->it2);
  }

  if (it->it1 == NULL) {
    it->it1 = RDL_listPaths(cfam->r, cfam->p, it->mode, gra, spi);
  }

  /* if second iterator is at end, increment first */
  if (it->it2->end) {
    /* do not increment first, if not possible! */
    if (!it->it1->end) {
      /* advance first iterator */
      RDL_pathIteratorNext(it->it1);

      /* re initialize second iterator */
      RDL_deletePathIterator(it->it2);
      it->it2 = RDL_listPaths(cfam->r, cfam->q, it->mode, gra, spi);
    }
  }

  /* if any of the iterators is STILL at the end, we have to change families */
  if (it->it1->end || it->it2->end) {
    /* if RCFs are at end */
    if (it->rcf_index == it->rcf_index_max) {
      if (it->urf_index == it->urf_index_max) {
        if (it->bcc_index == it->bcc_index_max) {
          it->end = 1;
        }
        else {
          ++it->bcc_index;
          it->urf_index = 0;
          it->urf_index_max = it->data->nofURFsPerBCC[it->bcc_index] - 1;
          it->rcf_index = 0;
          it->rcf_index_max = it->data->urfInfoPerBCC[it->bcc_index]->nofCFsPerURF[it->urf_index] - 1;
          if (it->mode == 'a') {
            number = it->data->bccGraphs->bcc_graphs[it->bcc_index]->V;
          }
          else {
            number = it->data->bccGraphs->bcc_graphs[it->bcc_index]->E;
          }
          free(it->compressed_cycle);
          RDL_bitset_init(&it->compressed_cycle, number);
          /* reset all iterators */
          RDL_deletePathIterator(it->it1);
          it->it1 = NULL;
          RDL_deletePathIterator(it->it2);
          it->it2 = NULL;
          /* now try again with new RCF */
          RDL_cycleIteratorNext(it);
        }
      }
      else {
        ++it->urf_index;
        it->rcf_index = 0;
        it->rcf_index_max = uInfo->nofCFsPerURF[it->urf_index] - 1;
        /* reset all iterators */
        RDL_deletePathIterator(it->it1);
        it->it1 = NULL;
        RDL_deletePathIterator(it->it2);
        it->it2 = NULL;
        /* now try again with new RCF */
        RDL_cycleIteratorNext(it);
      }
    }
    else {
      ++it->rcf_index;
      ++it->running_rcf;
      /* reset all iterators */
      RDL_deletePathIterator(it->it1);
      it->it1 = NULL;
      RDL_deletePathIterator(it->it2);
      it->it2 = NULL;
      /* now try again with new RCF */
      RDL_cycleIteratorNext(it);
    }
  }
  else {
    /* otherwise, a new cycle is born ... */
    RDL_combinePathsToCycle(it->compressed_cycle, it->it1, it->it2, cfam);
  }

  return it;
}